

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

InlineRep * __thiscall
absl::lts_20240722::Cord::InlineRep::operator=(InlineRep *this,InlineRep *src)

{
  bool bVar1;
  InlineRep *src_local;
  InlineRep *this_local;
  
  bVar1 = is_tree(this);
  if (bVar1) {
    absl::lts_20240722::Cord::InlineRep::UnrefTree();
  }
  cord_internal::InlineData::operator=(&this->data_,&src->data_);
  ResetToEmpty(src);
  return this;
}

Assistant:

inline Cord::InlineRep& Cord::InlineRep::operator=(
    Cord::InlineRep&& src) noexcept {
  if (is_tree()) {
    UnrefTree();
  }
  data_ = src.data_;
  src.ResetToEmpty();
  return *this;
}